

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text2mecab.c
# Opt level: O2

void text2mecab(char *output,char *input)

{
  char cVar1;
  size_t sVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  char *pcVar7;
  uint uVar8;
  int i;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  
  sVar2 = strlen(input);
  iVar4 = 0;
  iVar11 = 0;
  uVar10 = 0xffffffff;
  do {
    pcVar7 = input + iVar11;
    while( true ) {
      lVar3 = (long)iVar4;
      if ((int)sVar2 <= iVar11) {
        output[lVar3] = '\0';
        return;
      }
      for (lVar5 = 0; lVar5 != 0x170; lVar5 = lVar5 + 2) {
        uVar10 = 0;
        while( true ) {
          if (text2mecab_conv_list[lVar5][uVar10] == '\0') {
            uVar6 = (ulong)((uint)lVar5 | 1);
            goto LAB_0011e711;
          }
          if (pcVar7[uVar10] != text2mecab_conv_list[lVar5][uVar10]) break;
          uVar10 = uVar10 + 1;
        }
        uVar10 = 0xffffffff;
      }
      if ((int)uVar10 != -1) break;
      cVar1 = input[iVar11];
      if (cVar1 < '\0') {
        uVar10 = 0;
LAB_0011e6c8:
        if ((0x49UL >> (uVar10 & 0x3f) & 1) != 0) {
          if ((cVar1 < text2mecab_kanji_range[uVar10 + 1]) ||
             (text2mecab_kanji_range[uVar10 + 2] < cVar1)) goto LAB_0011e6da;
          uVar9 = (uint)text2mecab_kanji_range[uVar10];
          uVar10 = (ulong)uVar9;
          lVar3 = (long)iVar4;
          iVar4 = 0;
          uVar8 = 0;
          if (0 < (int)uVar9) {
            uVar8 = uVar9;
          }
          for (; -uVar8 != iVar4; iVar4 = iVar4 + -1) {
            output[lVar3] = *pcVar7;
            lVar3 = lVar3 + 1;
            pcVar7 = pcVar7 + 1;
          }
          iVar4 = -iVar4;
          goto LAB_0011e72c;
        }
        fwrite("WARNING: text2mecab() in text2mecab.c: Wrong character.\n",0x38,1,_stderr);
      }
      iVar11 = iVar11 + 1;
      pcVar7 = pcVar7 + 1;
      uVar10 = 0xffffffff;
    }
    uVar6 = 0x171;
LAB_0011e711:
    for (pcVar7 = text2mecab_conv_list[uVar6]; *pcVar7 != '\0'; pcVar7 = pcVar7 + 1) {
      output[lVar3] = *pcVar7;
      lVar3 = lVar3 + 1;
    }
    iVar4 = (int)uVar10;
LAB_0011e72c:
    iVar11 = iVar11 + iVar4;
    iVar4 = (int)lVar3;
  } while( true );
LAB_0011e6da:
  uVar10 = uVar10 + 3;
  goto LAB_0011e6c8;
}

Assistant:

void text2mecab(char *output, const char *input)
{
   int i, j;
   const int length = strlen(input);
   const char *str;
   int index = 0;
   int s, e = -1;

   for (s = 0; s < length;) {
      str = &input[s];
      /* search */
      for (i = 0; text2mecab_conv_list[i] != NULL; i += 2) {
         e = strtopcmp(str, text2mecab_conv_list[i]);
         if (e != -1)
            break;
      }
      if (e != -1) {
         /* convert */
         s += e;
         str = text2mecab_conv_list[i + 1];
         for (j = 0; str[j] != '\0'; j++)
            output[index++] = str[j];
      } else if (text2mecab_control_range[0] <= str[0] && str[0] <= text2mecab_control_range[1]) {
         /* control character */
         s++;
      } else {
         /* multi byte character */
         e = -1;
         for (j = 0; text2mecab_kanji_range[j] > 0; j += 3) {
            if (text2mecab_kanji_range[j + 1] <= str[0] && text2mecab_kanji_range[j + 2] >= str[0]) {
               e = text2mecab_kanji_range[j];
               break;
            }
         }
         if (e > 0) {
            for (j = 0; j < e; j++)
               output[index++] = input[s++];
         } else {
            /* unknown */
            fprintf(stderr, "WARNING: text2mecab() in text2mecab.c: Wrong character.\n");
            s++;
         }
      }
   }
   output[index] = '\0';
}